

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O1

char * __thiscall Pager::getPage(Pager *this,uint32_t pageNum)

{
  char *pcVar1;
  ssize_t sVar2;
  
  if (100 < pageNum) {
    pcVar1 = "This page number is out of bounds.\n";
LAB_00102e3a:
    std::operator<<((ostream *)&std::cout,pcVar1);
    exit(1);
  }
  if (this->pages[pageNum] == (char *)0x0) {
    pcVar1 = (char *)operator_new__(0x1000);
    if (pageNum <= ((this->fileLength >> 0xc) + 1) - (uint)((this->fileLength & 0xfff) == 0)) {
      lseek(this->fileDescriptor,(ulong)(pageNum << 0xc),0);
      sVar2 = read(this->fileDescriptor,pcVar1,0x1000);
      if (sVar2 == -1) {
        pcVar1 = "Error reading file\n";
        goto LAB_00102e3a;
      }
    }
    this->pages[pageNum] = pcVar1;
    if (this->numOfPages <= pageNum) {
      this->numOfPages = pageNum + 1;
    }
  }
  return this->pages[pageNum];
}

Assistant:

char *Pager::getPage(uint32_t pageNum) {
	if (pageNum > MAX_PAGES) {
		std::cout << "This page number is out of bounds.\n";
		exit(EXIT_FAILURE);
	}

	if (pages[pageNum] == nullptr) {
		char *page = new char[PAGE_SIZE];
		uint32_t numOfPages_ = fileLength / PAGE_SIZE;

		//incomplete page
		if(fileLength % PAGE_SIZE) {
			numOfPages_ += 1;
		}

		if (pageNum <= numOfPages_) {
			lseek(fileDescriptor, pageNum * PAGE_SIZE, SEEK_SET);
			ssize_t numOfBytesRead = read(fileDescriptor, page, PAGE_SIZE);
			if (numOfBytesRead == -1) {
				std::cout << "Error reading file\n";
				exit(EXIT_FAILURE);
			}
		}
		pages[pageNum] = page;
		if (pageNum >= numOfPages) {
			this->numOfPages = pageNum + 1;
		}
	}
	return pages[pageNum];
}